

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O2

void __thiscall
loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
          (loser_tree<unsigned_char*> *this,pair<unsigned_char_**,_unsigned_long> *begin,
          pair<unsigned_char_**,_unsigned_long> *end)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = (ulong)((long)end - (long)begin) >> 4;
  uVar2 = (uint)uVar5;
  iVar1 = 0x1f;
  if (uVar2 - 1 != 0) {
    for (; uVar2 - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  uVar6 = 2 << ((byte)iVar1 & 0x1f);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(uint *)(this + 0x10) = uVar2;
  *(uint *)(this + 0x14) = uVar6;
  if (1 < uVar2) {
    pvVar3 = malloc(0x14L << (-(((byte)iVar1 ^ 0x1f) + 0x20) & 0x3f));
    *(void **)this = pvVar3;
    pvVar3 = (void *)((long)pvVar3 + (ulong)uVar6 * 4);
    *(void **)(this + 8) = pvVar3;
    for (lVar4 = 0; (uVar5 & 0xffffffff) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      *(undefined8 *)((long)pvVar3 + lVar4) = *(undefined8 *)((long)&begin->first + lVar4);
      *(undefined8 *)((long)pvVar3 + lVar4 + 8) = *(undefined8 *)((long)&begin->second + lVar4);
    }
    memset((void *)((long)pvVar3 + (uVar5 & 0xffffffff) * 0x10),0,(ulong)(uVar6 - uVar2) << 4);
    uVar2 = loser_tree<unsigned_char_*>::init_min((loser_tree<unsigned_char_*> *)this,1);
    **(uint **)this = uVar2;
    return;
  }
  __assert_fail("_nonempty_streams>1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/losertree.h"
                ,0x53,
                "loser_tree<unsigned char *>::loser_tree(Iterator, Iterator) [T = unsigned char *, Iterator = std::pair<unsigned char **, unsigned long> *]"
               );
}

Assistant:

loser_tree(Iterator begin, Iterator end)
		: _nodes(0), _streams(0), _nonempty_streams(end-begin),
		  _stream_offset(1 << (log2(_nonempty_streams-1)+1))
	{
		assert(_nonempty_streams>1);
		void* raw = malloc(_stream_offset*sizeof(unsigned) +
		                   _stream_offset*sizeof(Stream));
		_nodes = static_cast<unsigned*>(raw);
		_streams = reinterpret_cast<Stream*>(
				static_cast<char*>(raw) +
					_stream_offset*sizeof(unsigned));
		for (unsigned i=0; i < _nonempty_streams; ++i) {
			_streams[i].stream = begin[i].first;
			_streams[i].n      = begin[i].second;
		}
		(void) memset(_streams+_nonempty_streams, 0,
			(_stream_offset-_nonempty_streams)*sizeof(Stream));
		_nodes[0] = init_min(1);
		//debug()<<*this;
	}